

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkCut.c
# Opt level: O2

void Lpk_NodePrintCut(Lpk_Man_t *p,Lpk_Cut_t *pCut,int fLeavesOnly)

{
  Abc_Obj_t *pAVar1;
  ulong uVar2;
  
  if (fLeavesOnly == 0) {
    puts("LEAVES:");
  }
  for (uVar2 = 0; uVar2 < (*(uint *)pCut & 0x3f); uVar2 = uVar2 + 1) {
    pAVar1 = Abc_NtkObj(p->pNtk,pCut->pLeaves[uVar2]);
    printf("%d,",(ulong)(uint)pAVar1->Id);
  }
  if (fLeavesOnly != 0) {
    return;
  }
  puts("\nNODES:");
  uVar2 = 0;
  do {
    if ((*(uint *)pCut >> 6 & 0x3f) <= uVar2) {
      putchar(10);
      return;
    }
    pAVar1 = Abc_NtkObj(p->pNtk,pCut->pNodes[uVar2]);
    printf("%d,",(ulong)(uint)pAVar1->Id);
    uVar2 = uVar2 + 1;
  } while ((*(uint *)&pAVar1->field_0x14 & 0xf) == 7);
  __assert_fail("Abc_ObjIsNode(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/lpk/lpkCut.c"
                ,0x1b4,"void Lpk_NodePrintCut(Lpk_Man_t *, Lpk_Cut_t *, int)");
}

Assistant:

void Lpk_NodePrintCut( Lpk_Man_t * p, Lpk_Cut_t * pCut, int fLeavesOnly )
{
    Abc_Obj_t * pObj;
    int i;
    if ( !fLeavesOnly )
        printf( "LEAVES:\n" );
    Lpk_CutForEachLeaf( p->pNtk, pCut, pObj, i )
        printf( "%d,", pObj->Id );
    if ( !fLeavesOnly )
    {
        printf( "\nNODES:\n" );
        Lpk_CutForEachNode( p->pNtk, pCut, pObj, i )
        {
            printf( "%d,", pObj->Id );
            assert( Abc_ObjIsNode(pObj) );
        }
        printf( "\n" );
    }
}